

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

DisasJumpType op_absf128(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  
  tcg_ctx = s->uc->tcg_ctx;
  tcg_gen_andi_i64_s390x(tcg_ctx,o->out,o->in1,0x7fffffffffffffff);
  tcg_gen_mov_i64_s390x(tcg_ctx,o->out2,o->in2);
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_absf128(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;

    tcg_gen_andi_i64(tcg_ctx, o->out, o->in1, 0x7fffffffffffffffull);
    tcg_gen_mov_i64(tcg_ctx, o->out2, o->in2);
    return DISAS_NEXT;
}